

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O1

int test_do_run_(test_ *test,int index)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  test_was_aborted_ = '\0';
  test_current_failures_ = 0;
  test_current_already_logged_ = 0;
  test_cond_failed_ = 0;
  test_current_unit_ = test;
  test_current_index_ = index;
  if (test_tap_ == '\0') {
    if (test_verbose_level_ < 3) {
      if (test_verbose_level_ < 1) {
        test_current_already_logged_ = 1;
      }
      else {
        iVar1 = test_print_in_color_(3,"Test %s... ",test->name);
        local_38 = 0x20202020;
        uStack_34 = 0x20202020;
        uStack_30 = 0x20202020;
        uStack_2c = 0x20202020;
        local_28 = 0x20202020;
        uStack_24 = 0x20202020;
        uStack_20 = 0x20202020;
        uStack_1c = 0x20202020;
        local_18 = 0x20202020;
        uStack_14 = 0x20202020;
        uStack_10 = 0x20202020;
        uStack_c = 0x20202020;
        if (iVar1 < 0x30) {
          printf("%.*s",(ulong)(0x30 - iVar1),&local_38);
        }
      }
    }
    else {
      test_print_in_color_(3,"Test %s:\n",test->name);
      test_current_already_logged_ = test_current_already_logged_ + 1;
    }
  }
  fflush(_stdout);
  fflush(_stderr);
  if (test_worker_ == '\0') {
    test_abort_has_jmp_buf_ = 1;
    iVar1 = _setjmp((__jmp_buf_tag *)test_abort_jmp_buf_);
    if (iVar1 != 0) {
      test_was_aborted_ = '\x01';
      goto LAB_00105b82;
    }
  }
  clock_gettime(test_timer_id_,(timespec *)&test_timer_start_);
  (*test->func)();
LAB_00105b82:
  test_abort_has_jmp_buf_ = 0;
  clock_gettime(test_timer_id_,(timespec *)&test_timer_end_);
  if (test_verbose_level_ < 3) {
    if ((0 < test_verbose_level_) && (test_current_failures_ == 0)) {
      test_finish_test_line_(0);
    }
  }
  else {
    test_line_indent_(1);
    if (test_current_failures_ == 0) {
      test_print_in_color_(4,"SUCCESS: ");
      puts("All conditions have passed.");
      if (test_timer_ != 0) {
        test_line_indent_(1);
        printf("Duration: ");
        test_timer_print_diff_();
        putchar(10);
      }
    }
    else {
      test_print_in_color_(5,"FAILED: ");
      if (test_was_aborted_ == '\0') {
        pcVar3 = "s";
        if (test_current_failures_ == 1) {
          pcVar3 = "";
        }
        pcVar2 = "have";
        if (test_current_failures_ == 1) {
          pcVar2 = "has";
        }
        printf("%d condition%s %s failed.\n",(ulong)(uint)test_current_failures_,pcVar3,pcVar2);
      }
      else {
        puts("Aborted.");
      }
    }
    putchar(10);
  }
  if ((1 < test_verbose_level_) && (test_case_name_[0] != '\0')) {
    test_case_current_already_logged_ = 0;
    test_case_name_[0] = '\0';
  }
  test_current_unit_ = (test_ *)0x0;
  return -(uint)(test_current_failures_ != 0);
}

Assistant:

static int
test_do_run_(const struct test_* test, int index)
{
    test_was_aborted_ = 0;
    test_current_unit_ = test;
    test_current_index_ = index;
    test_current_failures_ = 0;
    test_current_already_logged_ = 0;
    test_cond_failed_ = 0;

    test_begin_test_line_(test);

#ifdef __cplusplus
    try {
#endif

    /* This is good to do for case the test unit e.g. crashes. */
    fflush(stdout);
    fflush(stderr);

    if(!test_worker_) {
        test_abort_has_jmp_buf_ = 1;
        if(setjmp(test_abort_jmp_buf_) != 0) {
            test_was_aborted_ = 1;
            goto aborted;
        }
    }

    test_timer_get_time_(&test_timer_start_);
    test->func();
    aborted:
    test_abort_has_jmp_buf_ = 0;
    test_timer_get_time_(&test_timer_end_);

    if(test_verbose_level_ >= 3) {
        test_line_indent_(1);
        if(test_current_failures_ == 0) {
            test_print_in_color_(TEST_COLOR_GREEN_INTENSIVE_, "SUCCESS: ");
            printf("All conditions have passed.\n");

            if(test_timer_) {
                test_line_indent_(1);
                printf("Duration: ");
                test_timer_print_diff_();
                printf("\n");
            }
        } else {
            test_print_in_color_(TEST_COLOR_RED_INTENSIVE_, "FAILED: ");
            if(!test_was_aborted_) {
                printf("%d condition%s %s failed.\n",
                       test_current_failures_,
                       (test_current_failures_ == 1) ? "" : "s",
                       (test_current_failures_ == 1) ? "has" : "have");
            } else {
                printf("Aborted.\n");
            }
        }
        printf("\n");
    } else if(test_verbose_level_ >= 1 && test_current_failures_ == 0) {
        test_finish_test_line_(0);
    }

    test_case_(NULL);
    test_current_unit_ = NULL;
    return (test_current_failures_ == 0) ? 0 : -1;

#ifdef __cplusplus
    } catch(std::exception& e) {
        const char* what = e.what();
        test_check_(0, NULL, 0, "Threw std::exception");
        if(what != NULL)
            test_message_("std::exception::what(): %s", what);

        if(test_verbose_level_ >= 3) {
            test_line_indent_(1);
            test_print_in_color_(TEST_COLOR_RED_INTENSIVE_, "FAILED: ");
            printf("C++ exception.\n\n");
        }

        return -1;
    } catch(...) {
        test_check_(0, NULL, 0, "Threw an exception");

        if(test_verbose_level_ >= 3) {
            test_line_indent_(1);
            test_print_in_color_(TEST_COLOR_RED_INTENSIVE_, "FAILED: ");
            printf("C++ exception.\n\n");
        }

        return -1;
    }
#endif
}